

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Texture2D * __thiscall tcu::Texture2D::operator=(Texture2D *this,Texture2D *other)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  Texture2DView local_30;
  Texture2D *local_20;
  Texture2D *other_local;
  Texture2D *this_local;
  
  if (this != other) {
    local_20 = other;
    other_local = this;
    TextureLevelPyramid::operator=
              (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
    this->m_width = local_20->m_width;
    this->m_height = local_20->m_height;
    numLevels = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
    levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
              super_ConstPixelBufferAccess;
    Texture2DView::Texture2DView(&local_30,numLevels,levels);
    (this->m_view).m_numLevels = local_30.m_numLevels;
    *(undefined4 *)&(this->m_view).field_0x4 = local_30._4_4_;
    (this->m_view).m_levels = local_30.m_levels;
  }
  return this;
}

Assistant:

Texture2D& Texture2D::operator= (const Texture2D& other)
{
	if (this == &other)
		return *this;

	TextureLevelPyramid::operator=(other);

	m_width		= other.m_width;
	m_height	= other.m_height;
	m_view		= Texture2DView(getNumLevels(), getLevels());

	return *this;
}